

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* lest::split_option(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *__return_storage_ptr__,text *arg)

{
  bool bVar1;
  string local_1e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  byte local_19a;
  byte local_199;
  string local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  byte local_117;
  byte local_116;
  byte local_115;
  string local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  byte local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  long local_20;
  size_type pos;
  text *arg_local;
  
  pos = (size_type)arg;
  arg_local = &__return_storage_ptr__->first;
  local_20 = std::__cxx11::string::rfind((char)arg,0x3d);
  local_c1 = 0;
  local_115 = 0;
  local_116 = 0;
  local_117 = 0;
  local_199 = 0;
  local_19a = 0;
  bVar1 = local_20 != -1;
  if (bVar1) {
    std::__cxx11::string::substr((ulong)local_198,(ulong)arg);
    local_199 = 1;
    std::__cxx11::string::string((string *)&local_178,local_198);
    local_19a = 1;
    std::__cxx11::string::substr((ulong)local_1e0,(ulong)arg);
    std::__cxx11::string::string((string *)&local_1c0,local_1e0);
    std::make_pair<std::__cxx11::string,std::__cxx11::string>(&local_158,&local_178,&local_1c0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair(&local_60,&local_158);
  }
  else {
    std::__cxx11::string::string((string *)&local_c0,(string *)arg);
    local_c1 = 1;
    std::__cxx11::string::string(local_108);
    local_115 = 1;
    std::__cxx11::string::string((string *)&local_e8,local_108);
    local_116 = 1;
    std::make_pair<std::__cxx11::string,std::__cxx11::string>(&local_a0,&local_c0,&local_e8);
    local_117 = 1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair(&local_60,&local_a0);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair(__return_storage_ptr__,&local_60);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_60);
  if (bVar1) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_158);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string(local_1e0);
  }
  if ((local_19a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_178);
  }
  if ((local_199 & 1) != 0) {
    std::__cxx11::string::~string(local_198);
  }
  if ((local_117 & 1) != 0) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_a0);
  }
  if ((local_116 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_e8);
  }
  if ((local_115 & 1) != 0) {
    std::__cxx11::string::~string(local_108);
  }
  if ((local_c1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<text, text>
split_option( text arg )
{
    text::size_type pos = arg.rfind( '=' );

    return pos == text::npos
                ? std::make_pair( arg, text() )
                : std::make_pair( arg.substr( 0, pos ), arg.substr( pos + 1 ) );
}